

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O3

string __thiscall
mjs::anon_unknown_35::do_get_replacement_string
          (anon_unknown_35 *this,string *str,object_ptr *match,value *replace_value)

{
  uint32_t uVar1;
  uint *puVar2;
  wchar_t *pwVar3;
  gc_heap *extraout_RAX;
  undefined8 *puVar4;
  void *pvVar5;
  uint *puVar6;
  uint *puVar7;
  gc_heap *extraout_RAX_00;
  gc_heap *pgVar8;
  wostream *pwVar9;
  uint32_t index;
  uint32_t index_00;
  undefined8 extraout_RDX;
  ulong uVar10;
  undefined8 extraout_RDX_00;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  string sVar16;
  vector<mjs::value,_std::allocator<mjs::value>_> args;
  string rep_str;
  wostringstream _woss;
  undefined1 local_238 [8];
  undefined1 local_230 [32];
  value *local_210;
  undefined1 local_208 [32];
  undefined1 local_1e8 [16];
  wstring_view local_1d8;
  gc_heap_ptr_untyped *local_1c8;
  gc_heap_ptr_untyped *local_1c0;
  pointer local_1b8;
  wchar_t *local_1b0;
  undefined1 local_1a8 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_1a0 [11];
  
  local_1c8 = (gc_heap_ptr_untyped *)this;
  local_1c0 = (gc_heap_ptr_untyped *)str;
  if (replace_value->type_ == string) {
    local_1e8._0_8_ =
         (replace_value->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
         heap_;
    local_1e8._8_4_ = *(uint32_t *)((long)&replace_value->field_1 + 8);
    if ((gc_heap *)local_1e8._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_1e8._0_8_,(gc_heap_ptr_untyped *)local_1e8);
    }
    puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1e8);
    if (((ulong)*puVar2 == 0) ||
       (pwVar3 = wmemchr((wchar_t *)(puVar2 + 1),L'$',(ulong)*puVar2),
       pwVar3 == (wchar_t *)0x0 || (long)pwVar3 - (long)(puVar2 + 1) == -4)) {
      local_1c8->heap_ = (gc_heap *)local_1e8._0_8_;
      local_1c8->pos_ = local_1e8._8_4_;
      if ((gc_heap *)local_1e8._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_1e8._0_8_,local_1c8);
      }
    }
    else {
      local_208._0_8_ = local_208 + 0x10;
      local_208._8_8_ = (pointer)0x0;
      local_208._16_8_ = local_208._16_8_ & 0xffffffff00000000;
      local_210 = (value *)match;
      puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1e8);
      uVar12 = *puVar2;
      if (uVar12 != 0) {
        uVar10 = 0;
        do {
          iVar14 = (int)uVar10;
          if (puVar2[uVar10 + 1] == 0x24) {
            if (uVar12 <= iVar14 + 1U) {
              std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
              pwVar9 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
              std::operator<<(pwVar9,"$ at end of string");
              std::__cxx11::wstringbuf::str();
              local_1d8._M_len = local_230._0_8_;
              local_1d8._M_str = (wchar_t *)local_238;
              throw_runtime_error(&local_1d8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                                  ,0x12a);
            }
            uVar13 = puVar2[(ulong)(iVar14 + 1U) + 1];
            if ((int)uVar13 < 0x27) {
              if (uVar13 == 0x24) {
                std::__cxx11::wstring::push_back((wchar_t)local_208);
              }
              else {
                if (uVar13 != 0x26) {
LAB_0015ae41:
                  uVar13 = uVar13 - 0x30;
                  if (9 < uVar13) {
LAB_0015b123:
                    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
                    pwVar9 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
                    std::operator<<(pwVar9,"Invalid replacement characters");
                    std::__cxx11::wstringbuf::str();
                    local_1d8._M_len = local_230._0_8_;
                    local_1d8._M_str = (wchar_t *)local_238;
                    throw_runtime_error(&local_1d8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                                        ,0x14c);
                  }
                  uVar15 = iVar14 + 2;
                  if ((uVar15 < uVar12) && (puVar2[(ulong)uVar15 + 1] - 0x30 < 10)) {
                    uVar13 = (puVar2[(ulong)uVar15 + 1] + uVar13 * 10) - 0x30;
                    uVar15 = iVar14 + 3;
                  }
                  if (uVar13 == 0) {
                    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1a8);
                    pwVar9 = std::operator<<((wostream *)local_1a8,"Not implemented: ");
                    std::operator<<(pwVar9,"$0 used");
                    std::__cxx11::wstringbuf::str();
                    local_1d8._M_len = local_230._0_8_;
                    local_1d8._M_str = (wchar_t *)local_238;
                    throw_runtime_error(&local_1d8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                                        ,0x143);
                  }
                  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_210);
                  index_string_abi_cxx11_((wstring *)local_238,(mjs *)(ulong)uVar13,index_00);
                  local_1d8._M_len = local_230._0_8_;
                  local_1d8._M_str = (wchar_t *)local_238;
                  (**(code **)*puVar4)((value *)local_1a8,puVar4,&local_1d8);
                  if (local_238 != (undefined1  [8])(local_230 + 8)) {
                    operator_delete((void *)local_238,local_230._8_8_ * 4 + 4);
                  }
                  if (local_1a8._0_4_ == string) {
                    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_1a0[0].s_);
                    std::__cxx11::wstring::append((wchar_t *)local_208,(long)pvVar5 + 4);
                  }
                  value::destroy((value *)local_1a8);
                  goto LAB_0015b012;
                }
                puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_210);
                local_238 = (undefined1  [8])0x1;
                local_230._0_8_ = L"0";
                (**(code **)*puVar4)(local_1a8,puVar4,local_238);
                if (local_1a8._0_4_ != string) goto LAB_0015b0ec;
                pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_1a0[0].s_);
                std::__cxx11::wstring::append((wchar_t *)local_208,(long)pvVar5 + 4);
                value::destroy((value *)local_1a8);
              }
            }
            else if (uVar13 == 0x27) {
              puVar6 = (uint *)gc_heap_ptr_untyped::get(local_1c0);
              uVar15 = *puVar6;
              puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_210);
              local_1d8._M_len = 5;
              local_1d8._M_str = L"index";
              (**(code **)*puVar4)((value *)local_1a8,puVar4,&local_1d8);
              uVar1 = to_uint32((value *)local_1a8);
              puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_210);
              local_1b8 = (pointer)0x1;
              local_1b0 = L"0";
              (**(code **)*puVar4)(local_238,puVar4,&local_1b8);
              if (local_238._0_4_ != string) {
LAB_0015b0ec:
                __assert_fail("type_ == value_type::string",
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                              ,0x45,"const string &mjs::value::string_value() const");
              }
              puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_230);
              uVar10 = (ulong)*puVar7 + (ulong)uVar1;
              if (uVar15 < uVar10) {
                std::__throw_out_of_range_fmt
                          (anon_var_dwarf_1b750,"basic_string_view::substr",uVar10,(ulong)uVar15);
                goto LAB_0015b123;
              }
              std::__cxx11::wstring::append((wchar_t *)local_208,(ulong)(puVar6 + uVar10 + 1));
              value::destroy((value *)local_238);
              value::destroy((value *)local_1a8);
            }
            else {
              if (uVar13 != 0x60) goto LAB_0015ae41;
              pvVar5 = gc_heap_ptr_untyped::get(local_1c0);
              puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_210);
              local_238 = (undefined1  [8])0x5;
              local_230._0_8_ = L"index";
              (**(code **)*puVar4)((value *)local_1a8,puVar4,local_238);
              to_uint32((value *)local_1a8);
              std::__cxx11::wstring::append((wchar_t *)local_208,(long)pvVar5 + 4);
              value::destroy((value *)local_1a8);
            }
            uVar15 = iVar14 + 2;
          }
          else {
            std::__cxx11::wstring::push_back((wchar_t)local_208);
            uVar15 = iVar14 + 1;
          }
LAB_0015b012:
          uVar10 = (ulong)uVar15;
        } while (uVar15 < uVar12);
      }
      local_1a8 = (undefined1  [8])local_208._8_8_;
      local_1a0[0].s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           local_208._0_8_;
      string::string((string *)local_1c8,((gc_heap_ptr_untyped *)&local_210->type_)->heap_,
                     (wstring_view *)local_1a8);
      if ((gc_heap *)local_208._0_8_ != (gc_heap *)(local_208 + 0x10)) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ * 4 + 4);
      }
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1e8);
    pgVar8 = extraout_RAX_00;
    uVar11 = extraout_RDX_00;
  }
  else {
    local_208._0_8_ = (pointer)0x0;
    local_208._8_8_ = (pointer)0x0;
    local_208._16_8_ = (pointer)0x0;
    local_210 = replace_value;
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
    local_238 = (undefined1  [8])0x1;
    local_230._0_8_ = L"0";
    (**(code **)*puVar4)(local_1a8,puVar4);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::emplace_back<mjs::value>
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_208,(value *)local_1a8);
    value::destroy((value *)local_1a8);
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
    local_238 = (undefined1  [8])0x6;
    local_230._0_8_ = L"length";
    (**(code **)*puVar4)(local_1a8,puVar4);
    uVar1 = to_uint32((value *)local_1a8);
    value::destroy((value *)local_1a8);
    if (1 < uVar1) {
      uVar12 = 1;
      do {
        puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
        index_string_abi_cxx11_((wstring *)local_238,(mjs *)(ulong)uVar12,index);
        local_1e8._0_8_ = local_230._0_8_;
        local_1e8._8_8_ = local_238;
        (**(code **)*puVar4)((value *)local_1a8,puVar4,local_1e8);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::emplace_back<mjs::value>
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_208,(value *)local_1a8);
        value::destroy((value *)local_1a8);
        if (local_238 != (undefined1  [8])(local_230 + 8)) {
          operator_delete((void *)local_238,local_230._8_8_ * 4 + 4);
        }
        uVar12 = uVar12 + 1;
      } while (uVar1 != uVar12);
    }
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&match->super_gc_heap_ptr_untyped);
    local_238 = (undefined1  [8])0x5;
    local_230._0_8_ = L"index";
    (**(code **)*puVar4)(local_1a8,puVar4);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::emplace_back<mjs::value>
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_208,(value *)local_1a8);
    value::destroy((value *)local_1a8);
    local_1a8._0_4_ = 4;
    local_1a0[0]._0_8_ =
         (((gc_heap_ptr<mjs::gc_string> *)&local_1c0->heap_)->super_gc_heap_ptr_untyped).heap_;
    local_1a0[0]._8_4_ =
         (((gc_heap_ptr<mjs::gc_string> *)&local_1c0->heap_)->super_gc_heap_ptr_untyped).pos_;
    if ((gc_heap *)local_1a0[0]._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_1a0[0]._0_8_,(gc_heap_ptr_untyped *)&local_1a0[0].s_);
    }
    std::vector<mjs::value,_std::allocator<mjs::value>_>::emplace_back<mjs::value>
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_208,(value *)local_1a8);
    value::destroy((value *)local_1a8);
    pgVar8 = (match->super_gc_heap_ptr_untyped).heap_;
    call_function((value *)local_1a8,local_210,(value *)&value::undefined,
                  (vector<mjs::value,_std::allocator<mjs::value>_> *)local_208);
    to_string((mjs *)local_1c8,pgVar8,(value *)local_1a8);
    value::destroy((value *)local_1a8);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_208);
    pgVar8 = extraout_RAX;
    uVar11 = extraout_RDX;
  }
  sVar16.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = uVar11;
  sVar16.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = pgVar8;
  return (string)sVar16.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string do_get_replacement_string(const string& str, const object_ptr& match, const value& replace_value) {
    if (replace_value.type() == value_type::string) {
        const auto rep_str = replace_value.string_value();
        if (rep_str.view().find_first_of(L'$') == std::wstring_view::npos) {
            // Fast and easy
            return rep_str;
        }

        std::wstring res;
        const auto r = rep_str.view();
        for (uint32_t i = 0, l = static_cast<uint32_t>(r.length()); i < l;) {
            if (r[i] != L'$') {
                res += r[i];
                ++i;
                continue;
            }
            ++i;
            if (i >= l) {
                NOT_IMPLEMENTED("$ at end of string");
            }
            if (r[i] == '$') {
                res += L'$';
                ++i;
            } else if (r[i] == L'&') {
                // The matched substring
                res += match->get(L"0").string_value().view();
                ++i;
            } else if (r[i] == L'`') {
                //The portion of string that precedes the matched substring.
                ++i;
                res += str.view().substr(0, to_uint32(match->get(L"index")));
            } else if (r[i] == L'\'') {
                //The portion of string that follows the matched substring.
                ++i;
                res += str.view().substr(to_uint32(match->get(L"index")) + match->get(L"0").string_value().view().length());
            } else if (isdigit(r[i])) {
                uint32_t idx = r[i]-L'0';
                ++i;
                if (i < l && isdigit(r[i])) {
                    idx = idx*10+r[i]-L'0';
                    ++i;
                }
                if (!idx) {
                    NOT_IMPLEMENTED("$0 used");
                }
                auto cval = match->get(index_string(idx));
                if (cval.type() == value_type::string) {
                    res += cval.string_value().view();
                } else {
                    // Using empty string
                }
            } else {
                NOT_IMPLEMENTED("Invalid replacement characters");
            }
        }

        return string{match.heap(), res};
    }

    std::vector<value> args;
    args.push_back(match->get(L"0"));
    const auto m = to_uint32(match->get(L"length"));
    for (uint32_t i = 1; i < m; ++i) {
        args.push_back(match->get(index_string(i)));
    }
    args.push_back(match->get(L"index"));
    args.push_back(value{str});

    return to_string(match.heap(), call_function(replace_value, value::undefined, args));
}